

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_bfins_32_di(void)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint local_38;
  uint ea;
  uint mask_byte;
  uint data_byte;
  uint mask_long;
  uint data_long;
  uint mask_base;
  uint insert_byte;
  uint insert_long;
  uint insert_base;
  uint width;
  sint offset;
  uint word2;
  
  if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
  }
  else {
    insert_long = m68ki_read_imm_16();
    insert_base = insert_long >> 6 & 0x1f;
    uVar7 = m68ki_cpu.dar[insert_long >> 0xc & 7];
    uVar1 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
    uVar3 = m68ki_read_imm_16();
    if ((insert_long & 0x800) != 0) {
      insert_base = m68ki_cpu.dar[(int)(insert_long >> 6 & 7)];
    }
    if ((insert_long & 0x20) != 0) {
      insert_long = m68ki_cpu.dar[insert_long & 7];
    }
    local_38 = (int)insert_base / 8 + uVar1 + (int)(short)uVar3;
    insert_base = (int)insert_base % 8;
    if ((int)insert_base < 0) {
      insert_base = insert_base + 8;
      local_38 = local_38 - 1;
    }
    iVar4 = (insert_long - 1 & 0x1f) + 1;
    cVar2 = (char)iVar4;
    uVar5 = -1 << (0x20U - cVar2 & 0x1f);
    uVar6 = uVar7 << (0x20U - cVar2 & 0x1f);
    m68ki_cpu.n_flag = uVar6 >> 0x18;
    m68ki_cpu.not_z_flag = uVar6;
    uVar7 = m68ki_read_32_fc(local_38,m68ki_cpu.s_flag | m68ki_address_space);
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    m68ki_write_32_fc(local_38,m68ki_cpu.s_flag | 1,
                      uVar7 & (uVar5 >> ((byte)insert_base & 0x1f) ^ 0xffffffff) |
                      uVar6 >> ((byte)insert_base & 0x1f));
    if (0x20 < iVar4 + insert_base) {
      uVar5 = uVar5 & 0xff;
      uVar7 = m68ki_read_8_fc(local_38 + 4,m68ki_cpu.s_flag | m68ki_address_space);
      m68ki_cpu.not_z_flag = uVar7 & uVar5 | m68ki_cpu.not_z_flag;
      m68ki_write_8_fc(local_38 + 4,m68ki_cpu.s_flag | 1,uVar7 & (uVar5 ^ 0xffffffff) | uVar6 & 0xff
                      );
    }
  }
  return;
}

Assistant:

static void m68k_op_bfins_32_di(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint offset = (word2>>6)&31;
		uint width = word2;
		uint insert_base = REG_D[(word2>>12)&7];
		uint insert_long;
		uint insert_byte;
		uint mask_base;
		uint data_long;
		uint mask_long;
		uint data_byte = 0;
		uint mask_byte = 0;
		uint ea = EA_AY_DI_8();


		if(BIT_B(word2))
			offset = MAKE_INT_32(REG_D[offset&7]);
		if(BIT_5(word2))
			width = REG_D[width&7];

		/* Offset is signed so we have to use ugly math =( */
		ea += offset / 8;
		offset %= 8;
		if(offset < 0)
		{
			offset += 8;
			ea--;
		}
		width = ((width-1) & 31) + 1;

		mask_base = MASK_OUT_ABOVE_32(0xffffffff << (32 - width));
		mask_long = mask_base >> offset;

		insert_base = MASK_OUT_ABOVE_32(insert_base << (32 - width));
		FLAG_N = NFLAG_32(insert_base);
		FLAG_Z = insert_base;
		insert_long = insert_base >> offset;

		data_long = m68ki_read_32(ea);
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		m68ki_write_32(ea, (data_long & ~mask_long) | insert_long);

		if((width + offset) > 32)
		{
			mask_byte = MASK_OUT_ABOVE_8(mask_base);
			insert_byte = MASK_OUT_ABOVE_8(insert_base);
			data_byte = m68ki_read_8(ea+4);
			FLAG_Z |= (data_byte & mask_byte);
			m68ki_write_8(ea+4, (data_byte & ~mask_byte) | insert_byte);
		}
		return;
	}
	m68ki_exception_illegal();
}